

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdReplace<wabt::interp::Simd<unsigned_char,(unsigned_char)16>,unsigned_int>
          (Thread *this,Instr instr)

{
  Value VVar1;
  anon_union_16_6_113bff37_for_Value_0 local_20;
  
  VVar1 = Pop(this);
  local_20.v128_.v = (v128)Pop(this);
  *(char *)((long)&local_20 + (ulong)instr.field_2.imm_u8) = VVar1.field_0._0_1_;
  Push(this,(Value)local_20.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdReplace(Instr instr) {
  auto val = Pop<T>();
  auto simd = Pop<R>();
  simd[instr.imm_u8] = val;
  Push(simd);
  return RunResult::Ok;
}